

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O2

VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*> * __thiscall
Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*>::operator=
          (VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*> *this,
          VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*> *obj)

{
  int *piVar1;
  IteratorCore<Inferences::ALASCA::Demodulation::Lhs_*> *pIVar2;
  IteratorCore<Inferences::ALASCA::Demodulation::Lhs_*> *pIVar3;
  
  pIVar2 = this->_core;
  pIVar3 = obj->_core;
  this->_core = pIVar3;
  if (pIVar3 != (IteratorCore<Inferences::ALASCA::Demodulation::Lhs_*> *)0x0) {
    pIVar3->_refCnt = pIVar3->_refCnt + 1;
  }
  if (pIVar2 != (IteratorCore<Inferences::ALASCA::Demodulation::Lhs_*> *)0x0) {
    piVar1 = &pIVar2->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*pIVar2->_vptr_IteratorCore[1])();
    }
  }
  return this;
}

Assistant:

VirtualIterator& operator=(const VirtualIterator& obj)
  {
    IteratorCore<T>* oldCore=_core;
    _core=obj._core;
    if(_core) {
      _core->_refCnt++;
    }
    if(oldCore) {
      oldCore->_refCnt--;
      if(!oldCore->_refCnt) {
	delete oldCore;
      }
    }
    return *this;
  }